

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Tokenizer::StopRecording(Tokenizer *this)

{
  Tokenizer *this_local;
  
  if (this->buffer_pos_ != this->record_start_) {
    std::__cxx11::string::append
              ((char *)this->record_target_,(ulong)(this->buffer_ + this->record_start_));
  }
  this->record_target_ = (string *)0x0;
  this->record_start_ = -1;
  return;
}

Assistant:

inline void Tokenizer::StopRecording() {
  // Note:  The if() is necessary because some STL implementations crash when
  //   you call string::append(NULL, 0), presumably because they are trying to
  //   be helpful by detecting the NULL pointer, even though there's nothing
  //   wrong with reading zero bytes from NULL.
  if (buffer_pos_ != record_start_) {
    record_target_->append(buffer_ + record_start_,
                           buffer_pos_ - record_start_);
  }
  record_target_ = NULL;
  record_start_ = -1;
}